

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall re2::BitState::ShouldVisit(BitState *this,int id,char *p)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  
  pcVar2 = p + ((long)id * ((long)(this->text_).length_ + 1) - (long)(this->text_).ptr_);
  uVar1 = this->visited_[(ulong)pcVar2 >> 5];
  uVar3 = 1 << ((byte)pcVar2 & 0x1f);
  if ((uVar1 >> ((uint)pcVar2 & 0x1f) & 1) == 0) {
    this->visited_[(ulong)pcVar2 >> 5] = uVar3 | uVar1;
  }
  return (uVar3 & uVar1) == 0;
}

Assistant:

bool BitState::ShouldVisit(int id, const char* p) {
  size_t n = id * (text_.size() + 1) + (p - text_.begin());
  if (visited_[n/VisitedBits] & (1 << (n & (VisitedBits-1))))
    return false;
  visited_[n/VisitedBits] |= 1 << (n & (VisitedBits-1));
  return true;
}